

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O3

void __thiscall miniros::ServiceClient::deserializeFailed(ServiceClient *this,exception *e)

{
  string local_38;
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (deserializeFailed::loc.initialized_ == false) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"miniros.unknown_package","");
    console::initializeLogLocation(&deserializeFailed::loc,&local_38,Error);
    deserializeFailed();
  }
  if (deserializeFailed::loc.level_ != Error) {
    deserializeFailed();
  }
  if (deserializeFailed::loc.logger_enabled_ == true) {
    deserializeFailed((ServiceClient *)e);
  }
  return;
}

Assistant:

void ServiceClient::deserializeFailed(const std::exception& e)
{
  MINIROS_ERROR("Exception thrown while while deserializing service call: %s", e.what());
}